

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_mgga_inc.c
# Opt level: O1

void work_mgga_vxc_unpol(xc_func_type *p,size_t np,double *rho,double *sigma,double *lapl,
                        double *tau,xc_mgga_out_params *out)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  uint uVar6;
  double *pdVar7;
  bool bVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  long lVar11;
  size_t sVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double __x;
  double dVar27;
  double dVar28;
  double dVar29;
  double __x_00;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double __x_01;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  undefined1 auVar64 [16];
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  double dVar96;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  undefined1 auVar107 [16];
  double dVar108;
  double dVar109;
  double dVar110;
  double dVar111;
  double dVar112;
  undefined1 auVar113 [16];
  double dVar114;
  double dVar115;
  double dVar116;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  double dVar121;
  double dVar122;
  double dVar123;
  double dVar124;
  double dVar125;
  undefined1 auVar126 [16];
  double dVar127;
  double dVar128;
  double dVar129;
  double dVar130;
  double dVar131;
  double dVar132;
  double dVar133;
  double dVar134;
  double dVar135;
  double local_6e0;
  double local_6d0;
  double local_698;
  double local_678;
  double local_4a8;
  double local_318;
  
  if (np != 0) {
    sVar12 = 0;
    local_6d0 = 0.0;
    do {
      if (p->nspin == 2) {
        lVar11 = (long)(p->dim).rho * sVar12;
        dVar42 = rho[lVar11] + rho[lVar11 + 1];
      }
      else {
        dVar42 = rho[(long)(p->dim).rho * sVar12];
      }
      dVar39 = p->dens_threshold;
      if (dVar39 <= dVar42) {
        dVar42 = rho[(long)(p->dim).rho * sVar12];
        if (rho[(long)(p->dim).rho * sVar12] <= dVar39) {
          dVar42 = dVar39;
        }
        dVar43 = p->sigma_threshold * p->sigma_threshold;
        local_6e0 = sigma[(long)(p->dim).sigma * sVar12];
        if (sigma[(long)(p->dim).sigma * sVar12] <= dVar43) {
          local_6e0 = dVar43;
        }
        uVar6 = p->info->flags;
        if ((uVar6 >> 0x10 & 1) != 0) {
          local_6d0 = tau[(long)(p->dim).tau * sVar12];
          if (tau[(long)(p->dim).tau * sVar12] <= p->tau_threshold) {
            local_6d0 = p->tau_threshold;
          }
          if (((uVar6 >> 0x11 & 1) != 0) && (dVar43 = dVar42 * 8.0 * local_6d0, dVar43 <= local_6e0)
             ) {
            local_6e0 = dVar43;
          }
        }
        pdVar7 = (double *)p->params;
        dVar43 = p->zeta_threshold;
        bVar8 = dVar43 < 1.0;
        bVar9 = dVar39 < dVar42 * 0.5;
        dVar14 = cbrt(0.3183098861837907);
        dVar15 = dVar14 * 1.4422495703074083;
        dVar16 = dVar15 * 2.519842099789747;
        dVar17 = cbrt(dVar43);
        dVar44 = dVar43 * dVar17;
        dVar39 = dVar44;
        if (dVar43 < 2.0) {
          dVar39 = 2.5198420997897464;
        }
        dVar18 = cbrt(dVar42);
        dVar19 = cbrt(9.0);
        dVar65 = 1.0 / dVar18;
        dVar96 = (double)(~-(ulong)(2.0 <= dVar43) & 0x3ff0000000000000 |
                         (ulong)(1.2599210498948732 / dVar17) & -(ulong)(2.0 <= dVar43));
        dVar78 = dVar19 * dVar19 * dVar14 * dVar14 * p->cam_omega * 1.4422495703074083;
        dVar66 = (dVar65 * dVar78 * dVar96) / 18.0;
        dVar19 = 1.35;
        if (dVar66 <= 1.35) {
          dVar19 = dVar66;
        }
        dVar20 = erf((1.0 / dVar19) * 0.5);
        dVar45 = dVar19 * dVar19;
        dVar21 = exp((1.0 / dVar45) * -0.25);
        dVar79 = dVar66;
        if (dVar66 <= 1.35) {
          dVar79 = 1.35;
        }
        dVar121 = dVar79 * dVar79;
        dVar114 = dVar121 * dVar121;
        dVar80 = dVar114 * dVar114;
        auVar107._0_8_ = dVar80 * dVar80;
        auVar107._8_8_ = dVar80;
        auVar107 = divpd(_DAT_00f6f930,auVar107);
        dVar108 = dVar45 * -2.0 * (dVar21 + -1.0) + dVar21 + -1.5;
        dVar20 = (dVar19 + dVar19) * dVar108 + dVar20 * 1.7724538509055159;
        dVar80 = auVar107._8_8_;
        if (dVar66 < 1.35) {
          local_4a8 = dVar19 * -2.6666666666666665 * dVar20 + 1.0;
        }
        else {
          auVar40._0_8_ = dVar80 / (dVar121 * dVar114);
          auVar76._0_8_ = 1.0 / (dVar121 * dVar114);
          auVar97._8_8_ = dVar114;
          auVar97._0_8_ = dVar121;
          auVar117 = divpd(_DAT_00f6f930,auVar97);
          auVar118 = divpd(auVar117,_DAT_00f7bb30);
          auVar76._8_8_ = dVar80;
          auVar76 = divpd(auVar76,_DAT_00f7bb40);
          auVar117._8_8_ = dVar80;
          auVar117._0_8_ = dVar80;
          auVar97 = divpd(auVar117,auVar97);
          auVar97 = divpd(auVar97,_DAT_00f7bb50);
          auVar40._8_8_ = auVar107._0_8_;
          auVar40 = divpd(auVar40,_DAT_00f7bb60);
          local_4a8 = ((((((auVar118._0_8_ - auVar118._8_8_) + auVar76._0_8_) - auVar76._8_8_) +
                        auVar97._0_8_) - auVar97._8_8_) + auVar40._0_8_) - auVar40._8_8_;
        }
        dVar1 = pdVar7[1];
        dVar2 = pdVar7[2];
        dVar81 = local_6e0 * dVar1;
        dVar46 = dVar42 * dVar42;
        dVar100 = 1.0 / (dVar18 * dVar18);
        dVar82 = dVar100 / dVar46;
        dVar101 = dVar82 * 1.5874010519681996;
        dVar67 = local_6e0 * 1.5874010519681996 * dVar82;
        dVar68 = dVar67 * 0.003840616724010807 + 1.0;
        dVar22 = 1.0 / dVar68;
        dVar23 = cbrt(9.869604401089358);
        dVar23 = dVar23 * dVar23 * 3.3019272488946267;
        dVar83 = local_6d0 * 1.5874010519681996;
        dVar24 = dVar100 / dVar42;
        dVar84 = dVar83 * dVar24;
        dVar25 = dVar84 + dVar23 * 0.3;
        dVar102 = dVar23 * 0.3 - dVar84;
        dVar85 = dVar2 * dVar102;
        dVar47 = 1.0 / dVar25;
        dVar86 = dVar85 * dVar47 + dVar81 * 0.003840616724010807 * dVar101 * dVar22 + *pdVar7;
        dVar103 = local_4a8 * dVar86;
        dVar18 = dVar16 * 1.2599210498948732 * -0.046875 * dVar18 * dVar39;
        dVar48 = 0.0;
        if (bVar9 && bVar8) {
          dVar48 = dVar18 * dVar103;
          dVar48 = dVar48 + dVar48;
        }
        local_698 = 1.0;
        if (1.0 <= dVar43) {
          local_698 = p->zeta_threshold;
        }
        uVar13 = -(ulong)(1.0 <= dVar43);
        dVar43 = (double)((ulong)(1.0 / dVar17) & uVar13 | ~uVar13 & 0x3ff0000000000000);
        dVar87 = dVar16 * dVar65;
        dVar88 = dVar87 * 1.2599210498948732 * dVar43;
        dVar49 = SQRT(dVar88);
        dVar17 = dVar49;
        if (dVar88 < 0.0) {
          dVar17 = sqrt(dVar88);
          dVar49 = sqrt(dVar88);
        }
        dVar26 = dVar88 * 0.053425 + 1.0;
        dVar49 = dVar49 * dVar88;
        dVar50 = dVar14 * dVar14 * 2.080083823051904 * 1.5874010519681996;
        dVar51 = dVar50 * dVar100;
        dVar52 = dVar51 * 1.5874010519681996 * dVar43 * dVar43;
        dVar53 = dVar52 * 0.123235 + dVar49 * 0.204775 + dVar17 * 3.79785 + dVar88 * 0.8969;
        __x = 16.081979498692537 / dVar53 + 1.0;
        dVar27 = log(__x);
        local_318 = 0.0;
        dVar28 = ((double)(-(ulong)(0.0 <= p->zeta_threshold) & (ulong)dVar44) + dVar39 + -2.0) *
                 1.9236610509315362;
        dVar29 = dVar88 * 0.05137 + 1.0;
        dVar54 = dVar52 * 0.1562925 + dVar49 * 0.420775 + dVar17 * 7.05945 + dVar88 * 1.549425;
        __x_00 = 32.16395899738507 / dVar54 + 1.0;
        dVar30 = log(__x_00);
        dVar31 = dVar88 * 0.0278125 + 1.0;
        dVar55 = dVar52 * 0.1241775 + dVar49 * 0.1100325 + dVar17 * 5.1785 + dVar88 * 0.905775;
        dVar49 = 29.608749977793437 / dVar55 + 1.0;
        dVar52 = log(dVar49);
        if (bVar9 && bVar8) {
          dVar56 = dVar26 * 0.0621814 * dVar27;
          local_318 = (dVar28 * 0.0197516734986138 * dVar31 * dVar52 +
                      ((dVar31 * dVar52 * -0.0197516734986138 +
                       dVar29 * -0.0310907 * dVar30 + dVar56) * dVar28 - dVar56)) * local_698 * 0.5;
        }
        dVar56 = pdVar7[3];
        dVar3 = pdVar7[4];
        dVar63 = pdVar7[5];
        dVar4 = pdVar7[6];
        dVar5 = pdVar7[7];
        dVar135 = SQRT(dVar87);
        local_678 = dVar135;
        if (dVar87 < 0.0) {
          local_678 = sqrt(dVar87);
        }
        dVar129 = local_6e0 * dVar56;
        dVar133 = dVar67 * 0.46914023462026644 + 1.0;
        dVar130 = 1.0 / dVar133;
        dVar109 = dVar102 * dVar3;
        dVar127 = dVar102 * dVar102;
        dVar89 = dVar127 * dVar63;
        dVar122 = dVar25 * dVar25;
        dVar115 = 1.0 / dVar122;
        dVar104 = local_6e0 * local_6e0;
        dVar32 = dVar104 * dVar104;
        dVar105 = dVar104 * dVar32;
        dVar134 = dVar133 * dVar133;
        dVar131 = 1.0 / (dVar134 * dVar134);
        dVar123 = 1.0 / (dVar122 * dVar122);
        dVar33 = dVar105 * dVar4;
        dVar90 = dVar46 * dVar46;
        dVar91 = dVar90 * dVar90 * dVar90 * dVar90;
        dVar116 = 1.0 / dVar91;
        dVar110 = dVar131 / dVar134;
        dVar128 = dVar127 * dVar127 * dVar5;
        dVar124 = dVar123 * dVar128;
        dVar125 = dVar124 * 0.17058312527037534 * dVar105 * dVar116 * dVar110 +
                  dVar33 * 0.17058312527037534 * dVar116 * dVar110 +
                  dVar89 * dVar115 +
                  dVar129 * 0.46914023462026644 * dVar101 * dVar130 + dVar47 * dVar109;
        dVar34 = local_318 + local_318;
        dVar132 = dVar87 * 0.053425 + 1.0;
        if (dVar87 < 0.0) {
          dVar135 = sqrt(dVar87);
        }
        dVar57 = dVar51 * 0.123235 +
                 dVar135 * dVar87 * 0.204775 + local_678 * 3.79785 + dVar87 * 0.8969;
        __x_01 = 16.081979498692537 / dVar57 + 1.0;
        dVar35 = log(__x_01);
        dVar44 = (double)(~uVar13 & 0x3ff0000000000000 | uVar13 & (ulong)dVar44);
        dVar69 = (dVar44 + dVar44 + -2.0) * 1.9236610509315362;
        dVar92 = dVar87 * 0.0278125 + 1.0;
        dVar70 = dVar51 * 0.1241775 +
                 dVar135 * dVar87 * 0.1100325 + local_678 * 5.1785 + dVar87 * 0.905775;
        dVar135 = 29.608749977793437 / dVar70 + 1.0;
        dVar36 = log(dVar135);
        dVar71 = (dVar132 * -0.0621814 * dVar35 + dVar69 * 0.0197516734986138 * dVar92 * dVar36) -
                 dVar34;
        dVar44 = pdVar7[9];
        dVar84 = dVar84 * dVar23 * 0.6;
        dVar72 = local_6d0 * local_6d0 * 1.2599210498948732;
        dVar93 = dVar42 * dVar46;
        dVar73 = dVar72 * 4.0 * (dVar65 / dVar93);
        dVar58 = dVar84 - dVar73;
        dVar59 = dVar58 * dVar58;
        dVar94 = dVar59 * dVar44;
        dVar73 = dVar73 + dVar84;
        dVar95 = dVar73 * dVar73;
        dVar37 = 1.0 / dVar95;
        dVar60 = 1.0 / (dVar95 * dVar95);
        dVar111 = dVar59 * dVar59 * dVar59;
        dVar84 = pdVar7[10];
        dVar74 = dVar111 * dVar84;
        dVar61 = dVar60 / dVar95;
        dVar51 = pdVar7[0xb];
        dVar111 = dVar111 * dVar51;
        dVar38 = cbrt(dVar67);
        dVar67 = pdVar7[0xc];
        dVar112 = dVar59 * dVar67;
        dVar75 = dVar37 * dVar38;
        dVar62 = dVar112 * dVar75 + dVar111 * dVar61 * dVar38 + dVar94 * dVar37 + dVar61 * dVar74 +
                 pdVar7[8];
        dVar48 = dVar48 + dVar34 * dVar125 + dVar71 * dVar62;
        pdVar7 = out->zk;
        if ((pdVar7 != (double *)0x0) && ((p->info->flags & 1) != 0)) {
          lVar11 = (long)(p->dim).zk * sVar12;
          pdVar7[lVar11] = pdVar7[lVar11] + dVar48;
        }
        dVar106 = dVar65 / dVar42;
        dVar96 = (dVar78 * dVar106 * dVar96) / -54.0;
        if (dVar66 < 1.35) {
          dVar96 = (double)(~-(ulong)(1.35 < dVar66) & (ulong)dVar96);
          dVar96 = dVar96 * -2.6666666666666665 * dVar20 +
                   dVar19 * -2.6666666666666665 *
                   ((dVar19 + dVar19) *
                    (((dVar21 + -1.0) * dVar19 * -4.0 * dVar96 +
                     (1.0 / (dVar45 * dVar19)) * dVar96 * dVar21 * 0.5) -
                    (1.0 / dVar19) * dVar96 * dVar21) +
                   ((dVar96 + dVar96) * dVar108 - (1.0 / dVar45) * dVar21 * dVar96));
        }
        else {
          auVar64._0_8_ = dVar114 * dVar79;
          auVar64._8_8_ = dVar121 * dVar79;
          auVar40 = divpd(_DAT_00f6f930,auVar64);
          auVar118._8_8_ = dVar80;
          auVar118._0_8_ = dVar80;
          auVar76 = divpd(auVar118,auVar64);
          dVar96 = (double)(-(ulong)(1.35 < dVar66) & (ulong)dVar96);
          auVar41._0_8_ = auVar40._0_8_ * dVar96;
          auVar41._8_8_ = auVar40._8_8_ * dVar96;
          auVar40 = divpd(auVar41,_DAT_00f83d30);
          auVar98._8_8_ = 0x3ff0000000000000;
          auVar98._0_8_ = dVar80;
          auVar119._8_8_ = auVar64._8_8_ * dVar114;
          auVar119._0_8_ = dVar79;
          auVar97 = divpd(auVar98,auVar119);
          auVar99._0_8_ = auVar97._0_8_ * dVar96;
          auVar99._8_8_ = auVar97._8_8_ * dVar96;
          auVar97 = divpd(auVar99,_DAT_00f7bb80);
          auVar126._0_8_ = auVar76._0_8_ * dVar96;
          auVar126._8_8_ = auVar76._8_8_ * dVar96;
          auVar76 = divpd(auVar126,_DAT_00f7bb90);
          auVar107 = divpd(auVar107,auVar119);
          auVar113._0_8_ = auVar107._0_8_ * dVar96;
          auVar113._8_8_ = auVar107._8_8_ * dVar96;
          auVar107 = divpd(auVar113,_DAT_00f7bba0);
          dVar96 = ((((((auVar40._0_8_ - auVar40._8_8_) - auVar97._8_8_) + auVar97._0_8_) -
                     auVar76._8_8_) + auVar76._0_8_) - auVar107._8_8_) + auVar107._0_8_;
        }
        dVar19 = (dVar100 / dVar93) * 1.5874010519681996;
        dVar20 = (dVar65 / (dVar46 * dVar90)) * 1.2599210498948732;
        dVar66 = 1.0 / (dVar68 * dVar68);
        dVar79 = dVar83 * dVar82;
        dVar78 = 0.0;
        if (bVar9 && bVar8) {
          dVar78 = (dVar85 * dVar115 * 1.6666666666666667 * dVar79 +
                   local_6d0 * dVar2 * 1.6666666666666667 * dVar101 * dVar47 +
                   dVar81 * -0.010241644597362152 * dVar19 * dVar22 +
                   dVar104 * dVar1 * 7.866846304400802e-05 * dVar20 * dVar66) * local_4a8 * dVar18 +
                   dVar86 * dVar96 * dVar18 +
                   dVar39 * dVar100 * dVar16 * 1.2599210498948732 * dVar103 * -0.015625;
        }
        dVar39 = dVar106 * 2.519842099789747;
        if (dVar88 < 0.0) {
          dVar88 = sqrt(dVar88);
        }
        else {
          dVar88 = SQRT(dVar88);
        }
        dVar96 = 0.0;
        if (bVar9 && bVar8) {
          dVar121 = dVar43 * dVar43 * dVar50 * dVar24 * 1.5874010519681996;
          dVar96 = dVar39 * dVar43 * 1.2599210498948732;
          dVar45 = dVar14 * dVar88 * 1.4422495703074083 * dVar96;
          dVar96 = dVar14 * (1.0 / dVar17) * 1.4422495703074083 * dVar96;
          dVar17 = dVar106 * 1.2599210498948732;
          dVar80 = dVar43 * dVar17 * dVar16;
          dVar108 = dVar121 * -0.082785 +
                    dVar45 * -0.05501625 + dVar96 * -0.8630833333333333 + dVar80 * -0.301925;
          auVar77._8_8_ = dVar55 * dVar55;
          auVar77._0_8_ = dVar49;
          auVar107 = divpd(_DAT_00f6f930,auVar77);
          auVar10._8_8_ = __x_00;
          auVar10._0_8_ = dVar54 * dVar54;
          auVar97 = divpd(_DAT_00f6f930,auVar10);
          auVar120._0_8_ = dVar53 * dVar53;
          auVar120._8_8_ = __x;
          auVar40 = divpd(_DAT_00f6f930,auVar120);
          dVar21 = (dVar121 * -0.08215666666666667 +
                   dVar45 * -0.1023875 + dVar96 * -0.632975 + dVar80 * -0.29896666666666666) *
                   auVar40._8_8_ * dVar26 * auVar40._0_8_;
          dVar114 = dVar27 * dVar43 * dVar16 * 0.0011073470983333333 * dVar17;
          dVar96 = local_698 *
                   (dVar31 * dVar28 * -0.5848223622634646 *
                    auVar107._8_8_ * dVar108 * auVar107._0_8_ +
                   dVar15 * dVar28 * -0.00018311447306006544 * dVar39 *
                   dVar43 * 1.2599210498948732 * dVar52 +
                   (auVar107._8_8_ * dVar31 * 0.5848223622634646 * auVar107._0_8_ * dVar108 +
                   dVar16 * 0.00018311447306006544 * dVar17 * dVar52 * dVar43 +
                   ((((dVar121 * -0.104195 +
                      dVar45 * -0.2103875 + dVar96 * -1.176575 + dVar80 * -0.516475) * auVar97._8_8_
                      * dVar29 * auVar97._0_8_ +
                     dVar16 * 0.0005323764196666666 * dVar17 * dVar30 * dVar43) - dVar114) - dVar21)
                   ) * dVar28 + dVar114 + dVar21) * 0.5;
        }
        dVar131 = dVar131 / (dVar133 * dVar134);
        dVar16 = dVar14 * 2.519842099789747 * dVar106;
        dVar43 = (1.0 / local_678) * 1.4422495703074083 * dVar16;
        if (dVar87 < 0.0) {
          dVar87 = sqrt(dVar87);
        }
        else {
          dVar87 = SQRT(dVar87);
        }
        dVar63 = dVar63 * dVar102;
        dVar17 = 1.0 / (dVar122 * dVar25);
        dVar102 = dVar127 * dVar5 * dVar102;
        dVar21 = dVar100 / (dVar46 * dVar91);
        dVar16 = dVar16 * dVar87 * 1.4422495703074083;
        dVar45 = 1.0 / (dVar73 * dVar95);
        dVar108 = dVar59 * dVar59 * dVar58;
        dVar60 = dVar60 / (dVar73 * dVar95);
        dVar80 = 1.0 / (dVar38 * dVar38);
        dVar44 = dVar44 * dVar58;
        dVar67 = dVar67 * dVar58;
        dVar114 = dVar108 * dVar51 * 6.0 * dVar61 * dVar38;
        dVar121 = dVar111 * -6.0 * dVar60 * dVar38;
        dVar44 = dVar44 + dVar44;
        dVar94 = dVar94 * -2.0;
        dVar108 = dVar84 * dVar108 * 6.0;
        dVar74 = dVar74 * -6.0;
        dVar67 = dVar67 + dVar67;
        pdVar7 = out->vrho;
        if ((pdVar7 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
          dVar46 = dVar100 / (dVar93 * dVar91);
          dVar68 = 1.0 / (dVar42 * dVar91);
          dVar84 = dVar104 * local_6e0 * dVar32;
          dVar83 = dVar83 * dVar21 * dVar110;
          local_318 = local_318 *
                      (dVar124 * 1.2804385185856348 * dVar84 * dVar46 * dVar131 * 1.5874010519681996
                      + dVar124 * -2.7293300043260054 * dVar105 * dVar68 * dVar110 +
                        dVar105 * (dVar123 / dVar25) * dVar128 * 1.1372208351358355 * dVar83 +
                        dVar105 * dVar123 * dVar102 * 1.1372208351358355 * dVar83 +
                        dVar84 * dVar4 * 1.2804385185856348 * dVar46 * dVar131 * 1.5874010519681996
                        + dVar33 * -2.7293300043260054 * dVar68 * dVar110 +
                          dVar17 * dVar89 * 3.3333333333333335 * dVar79 +
                          dVar115 * dVar63 * 3.3333333333333335 * dVar79 +
                          dVar115 * dVar109 * 1.6666666666666667 * dVar79 +
                          local_6d0 * dVar3 * 1.6666666666666667 * dVar101 * dVar47 +
                          dVar129 * -1.2510406256540438 * dVar19 * dVar130 +
                          dVar20 * dVar104 * dVar56 * 1.1738269852776462 * (1.0 / dVar134));
          dVar125 = dVar125 * dVar96;
          dVar46 = dVar72 * 13.333333333333334 * (dVar65 / dVar90);
          dVar20 = dVar46 + -dVar23 * dVar79;
          dVar46 = -dVar23 * dVar79 - dVar46;
          dVar19 = local_6e0 * dVar80 * dVar19;
          lVar11 = (long)(p->dim).vrho * sVar12;
          pdVar7[lVar11] =
               (local_318 + local_318 + dVar78 + dVar78 + dVar125 + dVar125 +
                dVar62 * ((dVar106 * dVar14 * 2.519842099789747 *
                                     dVar69 * 1.4422495703074083 * -0.00018311447306006544 * dVar36
                           + dVar15 * 0.0011073470983333333 * dVar39 * dVar35 +
                             (1.0 / __x_01) *
                             (dVar50 * dVar24 * -0.08215666666666667 +
                             dVar16 * -0.1023875 +
                             dVar43 * -0.632975 + dVar15 * dVar39 * -0.29896666666666666) *
                             dVar132 * (1.0 / (dVar57 * dVar57)) +
                          dVar92 * dVar69 * -0.5848223622634646 *
                          (1.0 / dVar135) *
                          (dVar50 * dVar24 * -0.082785 +
                          dVar16 * -0.05501625 +
                          dVar43 * -0.8630833333333333 + dVar15 * dVar39 * -0.301925) *
                          (1.0 / (dVar70 * dVar70))) - (dVar96 + dVar96)) +
               (dVar37 * dVar112 * -0.8888888888888888 * dVar19 +
               dVar46 * dVar45 * dVar38 * dVar112 * -2.0 +
               dVar75 * dVar67 * dVar20 +
               dVar61 * dVar111 * -0.8888888888888888 * dVar19 +
               dVar46 * dVar121 +
               dVar114 * dVar20 +
               dVar60 * dVar74 * dVar46 +
               dVar20 * dVar61 * dVar108 + dVar37 * dVar44 * dVar20 + dVar46 * dVar45 * dVar94) *
               dVar71) * dVar42 + dVar48 + pdVar7[lVar11];
        }
        dVar39 = (dVar65 / (dVar90 * dVar42)) * 1.2599210498948732;
        dVar43 = 0.0;
        if (bVar9 && bVar8) {
          dVar43 = (dVar1 * 1.5874010519681996 * 0.003840616724010807 * dVar82 * dVar22 +
                   dVar66 * dVar81 * -2.9500673641503008e-05 * dVar39) * local_4a8 * dVar18;
          dVar43 = dVar43 + dVar43;
        }
        pdVar7 = out->vsigma;
        if ((pdVar7 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
          dVar14 = dVar80 * 1.5874010519681996 * dVar82;
          lVar11 = (long)(p->dim).vsigma * sVar12;
          pdVar7[lVar11] =
               (((dVar37 * dVar112 * dVar14) / 3.0 + (dVar61 * dVar111 * dVar14) / 3.0) * dVar71 +
               (dVar124 * -0.4801644444696131 * dVar21 * dVar105 * dVar131 * 1.5874010519681996 +
               dVar116 * dVar124 * 1.023498751622252 * local_6e0 * dVar32 * dVar110 +
               dVar33 * -0.4801644444696131 * dVar131 * dVar21 * 1.5874010519681996 +
               dVar4 * local_6e0 * dVar32 * 1.023498751622252 * dVar116 * dVar110 +
               dVar56 * 1.5874010519681996 * 0.46914023462026644 * dVar82 * dVar130 +
               (1.0 / dVar134) * dVar39 * dVar129 * -0.44018511947911726) * dVar34 + dVar43) *
               dVar42 + pdVar7[lVar11];
        }
        pdVar7 = out->vlapl;
        if ((pdVar7 != (double *)0x0) && ((~p->info->flags & 0x8002U) == 0)) {
          lVar11 = (long)(p->dim).vlapl * sVar12;
          pdVar7[lVar11] = pdVar7[lVar11] + 0.0;
        }
        dVar43 = dVar115 * 1.5874010519681996 * dVar24;
        dVar39 = 0.0;
        if (bVar9 && bVar8) {
          dVar18 = dVar18 * local_4a8 *
                            (dVar2 * -1.5874010519681996 * dVar47 * dVar24 - dVar85 * dVar43);
          dVar39 = dVar18 + dVar18;
        }
        pdVar7 = out->vtau;
        if ((pdVar7 != (double *)0x0) && ((~p->info->flags & 0x10002U) == 0)) {
          dVar96 = dVar105 * (dVar100 / (dVar42 * dVar91)) * dVar110 * 1.5874010519681996;
          dVar15 = dVar24 * 1.5874010519681996 * dVar23 * 0.6;
          dVar16 = local_6d0 * 1.2599210498948732 * 8.0 * (dVar65 / dVar93);
          dVar14 = dVar15 - dVar16;
          dVar16 = dVar16 + dVar15;
          lVar11 = (long)(p->dim).vtau * sVar12;
          pdVar7[lVar11] =
               dVar42 * (dVar71 * (dVar67 * dVar75 * dVar14 +
                                  dVar108 * dVar61 * dVar14 +
                                  dVar44 * dVar37 * dVar14 +
                                  dVar112 * -2.0 * dVar45 * dVar38 * dVar16 +
                                  dVar74 * dVar60 * dVar16 +
                                  dVar94 * dVar45 * dVar16 + dVar121 * dVar16 + dVar14 * dVar114) +
                        dVar34 * ((dVar123 / dVar25) * dVar128 * -0.6823325010815013 * dVar96 +
                                 dVar123 * dVar102 * -0.6823325010815013 * dVar96 +
                                 dVar89 * -2.0 * dVar17 * 1.5874010519681996 * dVar24 +
                                 dVar63 * -2.0 * dVar43 +
                                 (dVar3 * -1.5874010519681996 * dVar47 * dVar24 - dVar109 * dVar43))
                        + dVar39) + pdVar7[lVar11];
        }
      }
      sVar12 = sVar12 + 1;
    } while (np != sVar12);
  }
  return;
}

Assistant:

static void
WORK_MGGA(ORDER_TXT, SPIN_TXT)
(const XC(func_type) *p, size_t np,
 const double *rho, const double *sigma, const double *lapl, const double *tau,
 xc_mgga_out_params *out)
{

#ifdef XC_DEBUG
  /* This throws an exception when floating point errors are encountered */
  //feenableexcept(FE_DIVBYZERO | FE_INVALID | FE_OVERFLOW);
#endif

  size_t ip;
  double dens;
  double my_rho[2]={0.0, 0.0};
  double my_sigma[3]={0.0, 0.0, 0.0};
  double my_tau[2]={0.0, 0.0};

  for(ip = 0; ip < np; ip++){
    /* Screen low density */
    dens = (p->nspin == XC_POLARIZED) ? VAR(rho, ip, 0) + VAR(rho, ip, 1) : VAR(rho, ip, 0);
    if(dens < p->dens_threshold)
      continue;

    /* sanity check of input parameters */
    my_rho[0] = m_max(p->dens_threshold, VAR(rho, ip, 0));
    my_sigma[0] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 0));

    /* Many functionals shamelessly divide by tau, so we set a reasonable threshold */
    /* skip all checks on tau for the kinetic functionals */
    if(p->info->flags & XC_FLAGS_NEEDS_TAU){
      my_tau[0] = m_max(p->tau_threshold, VAR(tau, ip, 0));
      if(p->info->flags & XC_FLAGS_ENFORCE_FHC) {
        /* The Fermi hole curvature 1 - xs^2/(8*ts) must be positive */
        my_sigma[0] = m_min(my_sigma[0], 8.0*my_rho[0]*my_tau[0]);
      }
    }
    /* lapl can have any values */

    if(p->nspin == XC_POLARIZED){
      double s_ave;

      my_rho[1] = m_max(p->dens_threshold, VAR(rho, ip, 1));
      my_sigma[2] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 2));

      if(p->info->flags & XC_FLAGS_NEEDS_TAU){
        my_tau[1] = m_max(p->tau_threshold, VAR(tau, ip, 1));
        if(p->info->flags & XC_FLAGS_ENFORCE_FHC) {
          /* The Fermi hole curvature 1 - xs^2/(8*ts) must be positive */
          my_sigma[2] = m_min(my_sigma[2], 8.0*my_rho[1]*my_tau[1]);
        }
      }
      
      my_sigma[1] = VAR(sigma, ip, 1);
      s_ave = 0.5*(my_sigma[0] + my_sigma[2]);
      /* | grad n |^2 = |grad n_up + grad n_down|^2 > 0 */
      my_sigma[1] = (my_sigma[1] >= -s_ave ? my_sigma[1] : -s_ave);
      /* Since |grad n_up - grad n_down|^2 > 0 we also have */
      my_sigma[1] = (my_sigma[1] <= +s_ave ? my_sigma[1] : +s_ave);
    }

    FUNC(ORDER_TXT, SPIN_TXT)(p, ip, my_rho, my_sigma, &VAR(lapl, ip, 0), my_tau, out);

    /* check for NaNs */
#ifdef XC_DEBUG
    {
      const xc_dimensions *dim = &(p->dim);
      int ii, is_OK = 1;

      if(out->zk != NULL)
        is_OK = is_OK & isfinite(out->VAR(zk, ip, 0));

      if(out->vrho != NULL){
        for(ii=0; ii < dim->vrho; ii++)
          is_OK = is_OK && isfinite(out->VAR(vrho, ip, ii));
        for(ii=0; ii < dim->vsigma; ii++)
          is_OK = is_OK && isfinite(out->VAR(vsigma, ip, ii));
        if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
          for(ii=0; ii < dim->vlapl; ii++)
            is_OK = is_OK && isfinite(out->VAR(vlapl, ip, ii));
        if(p->info->flags & XC_FLAGS_NEEDS_TAU)
          for(ii=0; ii < dim->vtau; ii++)
            is_OK = is_OK && isfinite(out->VAR(vtau, ip, ii));
      }

      if(!is_OK){
        printf("Problem in the evaluation of the functional\n");
        if(p->nspin == XC_UNPOLARIZED){
          printf("./xc-get_data %d 1 ", p->info->number);
          if(p->info->flags & (XC_FLAGS_NEEDS_LAPLACIAN | XC_FLAGS_NEEDS_TAU))
            printf("%le 0.0 %le 0.0 0.0 %le 0.0 %le 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(lapl, ip, 0), VAR(tau, ip, 0));
          else if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
            printf("%le 0.0 %le 0.0 0.0 %le 0.0 0.0 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(lapl, ip, 0));
          else
            printf("%le 0.0 %le 0.0 0.0 0.0 0.0 %le 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(tau, ip, 0));
        }else{
          printf("./xc-get_data %d 2 ", p->info->number);
          if(p->info->flags & (XC_FLAGS_NEEDS_LAPLACIAN | XC_FLAGS_NEEDS_TAU))
            printf("%le %le %le %le %le %le %le %le %le\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(lapl, ip, 0), VAR(lapl, ip, 1),
                   VAR(tau, ip, 0), VAR(tau, ip, 1));
          else if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
            printf("%le %le %le %le %le %le %le 0.0 0.0\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(lapl, ip, 0), VAR(lapl, ip, 1));
          else
            printf("%le %le %le %le %le 0.0 0.0 %le %le\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(tau, ip, 0), VAR(tau, ip, 1));
        }
      }
    }
#endif
  }   /* for(ip) */

}